

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  uint in_stack_00000008;
  LodePNGState state;
  uint error;
  uint local_13c;
  uint local_104;
  LodePNGState *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  char **in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff60;
  uchar **in_stack_ffffffffffffff68;
  uint local_30;
  
  LodePNGState::LodePNGState((LodePNGState *)&stack0xfffffffffffffe30);
  lodepng_state_init((LodePNGState *)0x120e56);
  local_13c = in_stack_00000008;
  local_104 = in_stack_00000008;
  lodepng_encode(in_stack_ffffffffffffff68,(size_t *)in_stack_ffffffffffffff60,
                 (uchar *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  lodepng_state_cleanup((LodePNGState *)0x120edb);
  LodePNGState::~LodePNGState((LodePNGState *)&stack0xfffffffffffffe30);
  return local_30;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
	unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth)
{
	unsigned error;
	LodePNGState state;
	lodepng_state_init(&state);
	state.info_raw.colortype = colortype;
	state.info_raw.bitdepth = bitdepth;
	state.info_png.color.colortype = colortype;
	state.info_png.color.bitdepth = bitdepth;
	lodepng_encode(out, outsize, image, w, h, &state);
	error = state.error;
	lodepng_state_cleanup(&state);
	return error;
}